

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O2

iterator * __thiscall
HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(iterator *this)

{
  double **ppdVar1;
  int iVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = this->currentNode;
  iVar5 = this->nodeLeft[iVar2];
  iVar4 = this->nodeRight[iVar2];
  if (iVar5 == -1) {
    if (iVar4 == -1) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar4 = piVar3[-1];
      this->currentNode = iVar4;
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -1;
    }
    else {
      this->currentNode = iVar4;
    }
  }
  else {
    if (iVar4 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->stack,this->nodeRight + iVar2);
      iVar5 = this->nodeLeft[this->currentNode];
    }
    this->currentNode = iVar5;
    iVar4 = iVar5;
  }
  (this->pos_).index_ = (this->pos_).index_ + (iVar4 - iVar2);
  ppdVar1 = &(this->pos_).value_;
  *ppdVar1 = *ppdVar1 + (iVar4 - iVar2);
  return this;
}

Assistant:

iterator& operator++() {
      HighsInt offset = -currentNode;
      if (nodeLeft[currentNode] != -1) {
        if (nodeRight[currentNode] != -1)
          stack.push_back(nodeRight[currentNode]);
        currentNode = nodeLeft[currentNode];
      } else if (nodeRight[currentNode] != -1) {
        currentNode = nodeRight[currentNode];
      } else {
        currentNode = stack.back();
        stack.pop_back();
      }
      offset += currentNode;
      pos_.index_ += offset;
      pos_.value_ += offset;
      return *this;
    }